

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerStrategy.cpp
# Opt level: O1

int __thiscall AggressiveBotStrategy::intInput(AggressiveBotStrategy *this,StrategyContext context)

{
  int iVar1;
  vector<CardType,_std::allocator<CardType>_> *pvVar2;
  pointer pCVar3;
  int iVar4;
  long *plVar5;
  pointer pCVar6;
  
  switch(context) {
  case ATTACK_FROM_COUNTRY:
    iVar4 = attackFromCountryIndex(this);
    break;
  case ATTACK_TO_COUNTRY:
    iVar4 = attackToCountryIndex(this);
    break;
  case ATTACK_DICE_COUNT:
    iVar1 = *((this->super_PlayerStrategy).from)->pNumberOfTroops;
    iVar4 = 3;
    if (iVar1 < 4) {
      iVar4 = iVar1 + -1;
    }
    break;
  case ATTACK_NEW_ARMY_COUNT:
    iVar4 = 1;
    break;
  case DEFEND_DICE_COUNT:
    iVar4 = (1 < *((this->super_PlayerStrategy).to)->pNumberOfTroops) + 1;
    break;
  default:
    iVar4 = -1;
    break;
  case FORTIFY_FROM_COUNTRY:
    iVar4 = fortifyFromCountryIndex(this);
    break;
  case FORTIFY_TO_COUNTRY:
    iVar4 = fortifyToCountryIndex(this);
    break;
  case FORTIFY_ARMY_COUNT:
    iVar4 = *((this->super_PlayerStrategy).from)->pNumberOfTroops + -1;
    break;
  case REINFORCE_CARD_COUNT:
    pvVar2 = ((this->super_PlayerStrategy).player)->pCards->handPointer;
    pCVar6 = (pvVar2->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pCVar3 = (pvVar2->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (pCVar6 == pCVar3) {
      iVar4 = 0;
    }
    else {
      iVar4 = 0;
      do {
        iVar4 = iVar4 + (uint)(*pCVar6 == *(this->super_PlayerStrategy).exchangingCardType);
        pCVar6 = pCVar6 + 1;
      } while (pCVar6 != pCVar3);
    }
    break;
  case REINFORCE_ARMY_COUNT:
    iVar4 = reinforceArmyCount(this);
  }
  plVar5 = (long *)std::ostream::operator<<(&std::cout,iVar4);
  std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
  std::ostream::put((char)plVar5);
  std::ostream::flush();
  return iVar4;
}

Assistant:

int AggressiveBotStrategy::intInput(StrategyContext context) {
    int count = 0;

    switch ((int) context) {
        case StrategyContext::ATTACK_FROM_COUNTRY:
            count = attackFromCountryIndex();
            break;
        case StrategyContext::ATTACK_TO_COUNTRY:
            count = attackToCountryIndex();
            break;
        case StrategyContext::ATTACK_DICE_COUNT:
            count = attackNumDice();
            break;
        case StrategyContext::ATTACK_NEW_ARMY_COUNT:
            count = 1;
            break;
        case StrategyContext::DEFEND_DICE_COUNT:
            count = defendNumDice();
            break;
        case StrategyContext::FORTIFY_FROM_COUNTRY:
            count = fortifyFromCountryIndex();
            break;
        case StrategyContext::FORTIFY_TO_COUNTRY:
            count = fortifyToCountryIndex();
            break;
        case StrategyContext::FORTIFY_ARMY_COUNT:
            count = fortifyArmyCount();
            break;
        case StrategyContext::REINFORCE_ARMY_COUNT:
            count = reinforceArmyCount();
            break;
        case StrategyContext::REINFORCE_CARD_COUNT:
            count = numCards();
            break;
        default: {
            count = -1;
        }
    }
    std::cout << count << std::endl;
    return count;
}